

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyDrawMeshIndirectAttribs
               (DrawMeshIndirectAttribs *Attribs,Uint32 IndirectCmdStride)

{
  IBuffer *pIVar1;
  int iVar2;
  BIND_FLAGS BVar3;
  Char *pCVar4;
  undefined4 extraout_var;
  char (*in_RCX) [49];
  undefined8 in_R9;
  char (*in_stack_fffffffffffffee0) [7];
  undefined1 local_f8 [8];
  string msg_4;
  Uint64 ReqCountBufSize;
  string msg_3;
  BufferDesc *CntBuffDesc;
  string msg_2;
  Uint64 ReqAttrBufSize;
  string msg_1;
  BufferDesc *ArgsBuffDesc;
  undefined1 local_48 [8];
  string msg;
  IBuffer *pCounterBuffer;
  IBuffer *pAttribsBuffer;
  Uint32 IndirectCmdStride_local;
  DrawMeshIndirectAttribs *Attribs_local;
  
  pIVar1 = Attribs->pAttribsBuffer;
  msg.field_2._8_8_ = Attribs->pCounterBuffer;
  if (pIVar1 == (IBuffer *)0x0) {
    FormatString<char[41],char[49]>
              ((string *)local_48,(Diligent *)"Draw mesh indirect attribs are invalid: ",
               (char (*) [41])"indirect draw arguments buffer must not be null.",in_RCX);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"VerifyDrawMeshIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0xc2);
    std::__cxx11::string::~string((string *)local_48);
  }
  iVar2 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  msg_1.field_2._8_8_ = CONCAT44(extraout_var,iVar2);
  BVar3 = operator&(*(BIND_FLAGS *)(msg_1.field_2._8_8_ + 0x10),BIND_INDIRECT_DRAW_ARGS);
  if (BVar3 == BIND_NONE) {
    FormatString<char[41],char[33],char_const*,char[53]>
              ((string *)&ReqAttrBufSize,(Diligent *)"Draw mesh indirect attribs are invalid: ",
               (char (*) [41])0xf4c2f2,(char (*) [33])msg_1.field_2._8_8_,
               (char **)"\' was not created with BIND_INDIRECT_DRAW_ARGS flag.",(char (*) [53])in_R9
              );
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"VerifyDrawMeshIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0xc6);
    std::__cxx11::string::~string((string *)&ReqAttrBufSize);
  }
  msg_2.field_2._8_8_ =
       Attribs->DrawArgsOffset + (ulong)IndirectCmdStride * (ulong)Attribs->CommandCount;
  if (*(ulong *)(msg_1.field_2._8_8_ + 8) < (ulong)msg_2.field_2._8_8_) {
    in_R9 = msg_1.field_2._8_8_;
    FormatString<char[41],char[25],unsigned_long,char[38],char_const*,char[25],unsigned_long,char[7]>
              ((string *)&CntBuffDesc,(Diligent *)"Draw mesh indirect attribs are invalid: ",
               (char (*) [41])"invalid DrawArgsOffset (",(char (*) [25])&Attribs->DrawArgsOffset,
               (unsigned_long *)") or indirect draw arguments buffer \'",
               (char (*) [38])msg_1.field_2._8_8_,(char **)"\' size must be at least ",
               (char (*) [25])((long)&msg_2.field_2 + 8),(unsigned_long *)0xf4c40d,
               in_stack_fffffffffffffee0);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"VerifyDrawMeshIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0xc9);
    std::__cxx11::string::~string((string *)&CntBuffDesc);
  }
  if (msg.field_2._8_8_ != 0) {
    msg_3.field_2._8_8_ = (**(code **)(*(long *)msg.field_2._8_8_ + 0x20))();
    BVar3 = operator&(*(BIND_FLAGS *)(msg_3.field_2._8_8_ + 0x10),BIND_INDIRECT_DRAW_ARGS);
    if (BVar3 == BIND_NONE) {
      FormatString<char[41],char[26],char_const*,char[53]>
                ((string *)&ReqCountBufSize,(Diligent *)"Draw mesh indirect attribs are invalid: ",
                 (char (*) [41])"indirect counter buffer \'",(char (*) [26])msg_3.field_2._8_8_,
                 (char **)"\' was not created with BIND_INDIRECT_DRAW_ARGS flag.",
                 (char (*) [53])in_R9);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"VerifyDrawMeshIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0xd0);
      std::__cxx11::string::~string((string *)&ReqCountBufSize);
    }
    msg_4.field_2._8_8_ = Attribs->CounterOffset + 4;
    if (*(ulong *)(msg_3.field_2._8_8_ + 8) < (ulong)msg_4.field_2._8_8_) {
      FormatString<char[41],char[24],unsigned_long,char[22],char_const*,char[25],unsigned_long,char[7]>
                ((string *)local_f8,(Diligent *)"Draw mesh indirect attribs are invalid: ",
                 (char (*) [41])"invalid CounterOffset (",(char (*) [24])&Attribs->CounterOffset,
                 (unsigned_long *)") or counter buffer \'",(char (*) [22])msg_3.field_2._8_8_,
                 (char **)"\' size must be at least ",(char (*) [25])((long)&msg_4.field_2 + 8),
                 (unsigned_long *)0xf4c40d,(char (*) [7])local_f8);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"VerifyDrawMeshIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0xd3);
      std::__cxx11::string::~string((string *)local_f8);
    }
  }
  return true;
}

Assistant:

bool VerifyDrawMeshIndirectAttribs(const DrawMeshIndirectAttribs& Attribs, Uint32 IndirectCmdStride)
{
    const IBuffer* pAttribsBuffer = Attribs.pAttribsBuffer;
    const IBuffer* pCounterBuffer = Attribs.pCounterBuffer;

#define CHECK_DRAW_MESH_INDIRECT_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Draw mesh indirect attribs are invalid: ", __VA_ARGS__)

    CHECK_DRAW_MESH_INDIRECT_ATTRIBS(pAttribsBuffer != nullptr, "indirect draw arguments buffer must not be null.");
    const BufferDesc& ArgsBuffDesc = pAttribsBuffer->GetDesc();
    CHECK_DRAW_MESH_INDIRECT_ATTRIBS((ArgsBuffDesc.BindFlags & BIND_INDIRECT_DRAW_ARGS) != 0,
                                     "indirect draw arguments buffer '", ArgsBuffDesc.Name,
                                     "' was not created with BIND_INDIRECT_DRAW_ARGS flag.");
    const Uint64 ReqAttrBufSize = Attribs.DrawArgsOffset + Uint64{IndirectCmdStride} * Uint64{Attribs.CommandCount};
    CHECK_DRAW_MESH_INDIRECT_ATTRIBS(ReqAttrBufSize <= ArgsBuffDesc.Size, "invalid DrawArgsOffset (", Attribs.DrawArgsOffset,
                                     ") or indirect draw arguments buffer '", ArgsBuffDesc.Name, "' size must be at least ", ReqAttrBufSize, " bytes");


    if (pCounterBuffer != nullptr)
    {
        const BufferDesc& CntBuffDesc = pCounterBuffer->GetDesc();
        CHECK_DRAW_MESH_INDIRECT_ATTRIBS((CntBuffDesc.BindFlags & BIND_INDIRECT_DRAW_ARGS) != 0, "indirect counter buffer '",
                                         CntBuffDesc.Name, "' was not created with BIND_INDIRECT_DRAW_ARGS flag.");
        const Uint64 ReqCountBufSize = Attribs.CounterOffset + sizeof(Uint32);
        CHECK_DRAW_MESH_INDIRECT_ATTRIBS(ReqCountBufSize <= CntBuffDesc.Size, "invalid CounterOffset (", Attribs.CounterOffset,
                                         ") or counter buffer '", CntBuffDesc.Name, "' size must be at least ", ReqCountBufSize, " bytes");
    }
#undef CHECK_DRAW_MESH_INDIRECT_ATTRIBS

    return true;
}